

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O1

FString GetStatString(void)

{
  int iVar1;
  FString *in_RDI;
  ulong uVar2;
  long lVar3;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  in_RDI->Chars = FString::NullString.Nothing;
  if (LevelData.Count != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      iVar1 = *(int *)((long)&(LevelData.Array)->leveltime + lVar3);
      FString::AppendFormat
                (in_RDI,"Level %s - Kills: %d/%d - Secrets: %d/%d - Time: %d:%02d\n",
                 *(undefined8 *)((long)&((LevelData.Array)->Levelname).Chars + lVar3),
                 (ulong)*(uint *)((long)&(LevelData.Array)->killcount + lVar3),
                 (ulong)*(uint *)((long)&(LevelData.Array)->totalkills + lVar3),
                 (ulong)*(uint *)((long)&(LevelData.Array)->secretcount + lVar3),
                 (ulong)*(uint *)((long)&(LevelData.Array)->totalsecrets + lVar3),
                 (ulong)(uint)(iVar1 / 0x834),(ulong)(uint)((iVar1 / 0x23) % 0x3c));
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar2 < LevelData.Count);
  }
  return (FString)(char *)in_RDI;
}

Assistant:

FString GetStatString()
{
	FString compose;
	for(unsigned i = 0; i < LevelData.Size(); i++)
	{
		OneLevel *l = &LevelData[i];
		compose.AppendFormat("Level %s - Kills: %d/%d - Secrets: %d/%d - Time: %d:%02d\n", 
			l->Levelname.GetChars(), l->killcount, l->totalkills, l->secretcount, l->totalsecrets,
			l->leveltime/(60*TICRATE), (l->leveltime/TICRATE)%60);
	}
	return compose;
}